

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O1

RPCHelpMan * decodepsbt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_18;
  RPCArgOptions opts;
  undefined1 auVar2 [32];
  RPCHelpMan *in_RDI;
  long lVar3;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  undefined4 in_stack_ffffffffffffeb78;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffeb7c;
  undefined8 in_stack_ffffffffffffeb88;
  undefined8 in_stack_ffffffffffffeb90;
  undefined8 in_stack_ffffffffffffeb98;
  code *pcVar5;
  undefined8 in_stack_ffffffffffffeba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffeba8;
  pointer in_stack_ffffffffffffebb8;
  pointer pRVar6;
  pointer in_stack_ffffffffffffebc0;
  pointer pRVar7;
  pointer in_stack_ffffffffffffebc8;
  pointer pRVar8;
  undefined8 in_stack_ffffffffffffebd0;
  pointer in_stack_ffffffffffffebd8;
  pointer pRVar9;
  pointer in_stack_ffffffffffffebe0;
  pointer pRVar10;
  pointer in_stack_ffffffffffffebe8;
  pointer pRVar11;
  undefined8 in_stack_ffffffffffffebf0;
  pointer in_stack_ffffffffffffebf8;
  pointer in_stack_ffffffffffffec00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffec08;
  pointer in_stack_ffffffffffffec18;
  pointer in_stack_ffffffffffffec20;
  pointer in_stack_ffffffffffffec28;
  undefined8 in_stack_ffffffffffffec30;
  pointer in_stack_ffffffffffffec38;
  pointer in_stack_ffffffffffffec40;
  pointer in_stack_ffffffffffffec48;
  undefined8 in_stack_ffffffffffffec50;
  pointer in_stack_ffffffffffffec58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1388;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1368;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1350;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1338;
  allocator_type local_131a;
  allocator_type local_1319;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1318;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12c0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  allocator_type local_1289;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1288;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1270;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1258;
  RPCResults local_1240;
  allocator_type local_1221;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1220;
  string local_1208;
  string local_11e8;
  string local_11c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_11a8;
  size_type local_11a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1198;
  long *local_1188 [2];
  long local_1178 [2];
  long *local_1168 [2];
  long local_1158 [2];
  long *local_1148 [2];
  long local_1138 [2];
  long *local_1128 [2];
  long local_1118 [2];
  RPCResult local_1108;
  long *local_1080 [2];
  long local_1070 [2];
  long *local_1060 [2];
  long local_1050 [2];
  long *local_1040 [2];
  long local_1030 [2];
  long *local_1020 [2];
  long local_1010 [2];
  long *local_1000 [2];
  long local_ff0 [2];
  long *local_fe0 [2];
  long local_fd0 [2];
  long *local_fc0 [2];
  long local_fb0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_fa0;
  long *local_f80 [2];
  long local_f70 [2];
  pointer local_f60 [2];
  undefined1 local_f50 [152];
  RPCResult local_eb8;
  RPCResult local_e30;
  RPCResult local_da8;
  long *local_d20 [2];
  long local_d10 [2];
  long *local_d00 [2];
  long local_cf0 [2];
  RPCResult local_ce0;
  long *local_c58 [2];
  long local_c48 [2];
  long *local_c38 [2];
  long local_c28 [2];
  long *local_c18 [2];
  long local_c08 [2];
  long *local_bf8 [2];
  long local_be8 [2];
  long *local_bd8 [2];
  long local_bc8 [2];
  long *local_bb8 [2];
  long local_ba8 [2];
  long *local_b98 [2];
  long local_b88 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_b78;
  long *local_b58 [2];
  long local_b48 [2];
  pointer local_b38 [2];
  undefined1 local_b28 [152];
  RPCResult local_a90;
  RPCResult local_a08;
  long *local_980 [2];
  long local_970 [2];
  long *local_960 [2];
  long local_950 [2];
  RPCResult local_940;
  long *local_8b8 [2];
  long local_8a8 [2];
  long *local_898 [2];
  long local_888 [2];
  long *local_878 [2];
  long local_868 [2];
  long *local_858 [2];
  long local_848 [2];
  undefined1 local_838 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  long *local_7b0 [2];
  long local_7a0 [2];
  long *local_790 [2];
  long local_780 [2];
  RPCResult local_770;
  RPCResult local_6e8;
  RPCResult local_660;
  RPCResult local_5d8;
  RPCResult local_550;
  RPCResult local_4c8;
  RPCResult local_440;
  RPCResult local_3b8;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030[0] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"decodepsbt","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "Return a JSON object representing the serialized, base64-encoded partially signed Bitcoin transaction."
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"psbt","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"The PSBT base64 string","");
  local_260 = &local_250;
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  name.field_2._8_8_ = in_stack_ffffffffffffeb90;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeba0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeb98;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeba8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffebb8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffebc0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffebc8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffebd0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffebd8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffebe0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffebe8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffebf0;
  description_18._M_string_length = (size_type)in_stack_ffffffffffffec00;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebf8;
  description_18.field_2 = in_stack_ffffffffffffec08;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec20;
  opts._0_8_ = in_stack_ffffffffffffec18;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffec28;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffec30;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffec38;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffec40;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffec48;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffec50;
  opts._64_8_ = in_stack_ffffffffffffec58;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_18,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1220,__l,&local_1221);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_790[0] = local_780;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"tx","");
  local_7b0[0] = local_7a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7b0,"The decoded network-serialized unsigned transaction.","");
  local_858[0] = local_848;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"");
  local_878[0] = local_868;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_878,"The layout is the same as the output of decoderawtransaction.","")
  ;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description._M_string_length = in_stack_ffffffffffffeba0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description.field_2 = in_stack_ffffffffffffeba8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffebc0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffebb8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult
            ((RPCResult *)local_838,ELISION,m_key_name,description,inner,SUB81(local_858,0));
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_838;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1270,__l_00,&local_1289);
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_00._M_string_length = in_stack_ffffffffffffeba0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_00.field_2 = in_stack_ffffffffffffeba8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_770,OBJ,m_key_name_00,description_00,inner_00,SUB81(local_790,0));
  local_898[0] = local_888;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_898,"global_xpubs","");
  local_8b8[0] = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,"");
  local_960[0] = local_950;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_960,"");
  local_980[0] = local_970;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"");
  local_b38[0] = (pointer)local_b28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b38,"xpub","");
  local_b58[0] = local_b48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b58,"The extended public key this path corresponds to","");
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_01._M_string_length = in_stack_ffffffffffffeba0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_01.field_2 = in_stack_ffffffffffffeba8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult
            ((RPCResult *)(local_b28 + 0x10),STR,m_key_name_01,description_01,inner_01,
             SUB81(local_b38,0));
  local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"master_fingerprint","");
  local_b98[0] = local_b88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b98,"The fingerprint of the master key","");
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_02._M_string_length = in_stack_ffffffffffffeba0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_02.field_2 = in_stack_ffffffffffffeba8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_a90,STR_HEX,m_key_name_02,description_02,inner_02,SUB81(&local_b78,0))
  ;
  local_bb8[0] = local_ba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bb8,"path","");
  local_bd8[0] = local_bc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bd8,"The path","");
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_03._M_string_length = in_stack_ffffffffffffeba0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_03.field_2._M_local_buf = in_stack_ffffffffffffeba8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_a08,STR,m_key_name_03,description_03,inner_03,SUB81(local_bb8,0));
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)(local_b28 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_12c0,__l_01,&local_1319);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_04._M_string_length = in_stack_ffffffffffffeba0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_04.field_2 = in_stack_ffffffffffffeba8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_940,OBJ,m_key_name_04,description_04,inner_04,SUB81(local_960,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_940;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_12a8,__l_02,&local_131a);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_05._M_string_length = in_stack_ffffffffffffeba0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_05.field_2 = in_stack_ffffffffffffeba8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_6e8,ARR,m_key_name_05,description_05,inner_05,SUB81(local_898,0));
  local_bf8[0] = local_be8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf8,"psbt_version","");
  local_c18[0] = local_c08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c18,
             "The PSBT version number. Not to be confused with the unsigned transaction version","")
  ;
  local_1338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_06._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_06._M_string_length = in_stack_ffffffffffffeba0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_06.field_2 = in_stack_ffffffffffffeba8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_660,NUM,m_key_name_06,description_06,inner_06,SUB81(local_bf8,0));
  local_c38[0] = local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"proprietary","");
  local_c58[0] = local_c48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c58,"The global proprietary map","");
  local_d00[0] = local_cf0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d00,"");
  local_d20[0] = local_d10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d20,"");
  local_f60[0] = (pointer)local_f50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f60,"identifier","");
  local_f80[0] = local_f70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f80,"The hex string for the proprietary identifier","");
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_07._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_07._M_string_length = in_stack_ffffffffffffeba0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_07.field_2 = in_stack_ffffffffffffeba8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult
            ((RPCResult *)(local_f50 + 0x10),STR_HEX,m_key_name_07,description_07,inner_07,
             SUB81(local_f60,0));
  local_fa0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_fa0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa0,"subtype","");
  local_fc0[0] = local_fb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fc0,"The number for the subtype","");
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_08._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_08._M_string_length = in_stack_ffffffffffffeba0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_08.field_2 = in_stack_ffffffffffffeba8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_eb8,NUM,m_key_name_08,description_08,inner_08,SUB81(&local_fa0,0));
  local_fe0[0] = local_fd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"key","");
  local_1000[0] = local_ff0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1000,"The hex for the key","");
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_09._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_09._M_string_length = (size_type)in_RDI;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_09._M_string_length = in_stack_ffffffffffffeba0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_09.field_2 = in_stack_ffffffffffffeba8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_e30,STR_HEX,m_key_name_09,description_09,inner_09,SUB81(local_fe0,0));
  local_1020[0] = local_1010;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"value","");
  local_1040[0] = local_1030;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1040,"The hex for the value","");
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_10._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_10._M_string_length = (size_type)in_RDI;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_10._M_string_length = in_stack_ffffffffffffeba0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_10.field_2._M_local_buf = in_stack_ffffffffffffeba8._M_local_buf;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_da8,STR_HEX,m_key_name_10,description_10,inner_10,SUB81(local_1020,0))
  ;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)(local_f50 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1368,__l_03,(allocator_type *)&stack0xffffffffffffec17);
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_11._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_11._M_string_length = (size_type)in_RDI;
  m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_11._M_string_length = in_stack_ffffffffffffeba0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_11.field_2 = in_stack_ffffffffffffeba8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_ce0,OBJ,m_key_name_11,description_11,inner_11,false);
  __l_04._M_len = 1;
  __l_04._M_array = &local_ce0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1350,__l_04,(allocator_type *)&stack0xffffffffffffec16);
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_12._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_12._M_string_length = (size_type)in_RDI;
  m_key_name_12.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_12._M_string_length = in_stack_ffffffffffffeba0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_12.field_2 = in_stack_ffffffffffffeba8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_5d8,ARR,m_key_name_12,description_12,inner_12,SUB81(local_c38,0));
  local_1060[0] = local_1050;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1060,"unknown","");
  local_1080[0] = local_1070;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1080,"The unknown global fields","");
  local_1128[0] = local_1118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"key","");
  local_1148[0] = local_1138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1148,"(key-value pair) An unknown key-value pair","");
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_13._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_13._M_string_length = (size_type)in_RDI;
  m_key_name_13.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_13._M_string_length = in_stack_ffffffffffffeba0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_13.field_2 = in_stack_ffffffffffffeba8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult
            (&local_1108,STR_HEX,m_key_name_13,description_13,inner_13,SUB81(local_1128,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_1108;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebf8,__l_05,
             (allocator_type *)&stack0xffffffffffffebd7);
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_14._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb78;
  m_key_name_14._M_string_length = (size_type)in_RDI;
  m_key_name_14.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_14._M_string_length = in_stack_ffffffffffffeba0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_14.field_2 = in_stack_ffffffffffffeba8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffebc0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffebb8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebc8;
  RPCResult::RPCResult(&local_550,OBJ_DYN,m_key_name_14,description_14,inner_14,SUB81(local_1060,0))
  ;
  RPCResult::RPCResult(&local_4c8,&decodepsbt_inputs);
  RPCResult::RPCResult(&local_440,&decodepsbt_outputs);
  local_1168[0] = local_1158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1168,"fee","");
  local_1188[0] = local_1178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1188,
             "The transaction fee paid if all UTXOs slots in the PSBT have been filled.","");
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  uVar4 = 0;
  auVar2._4_8_ = in_RDI;
  auVar2._0_4_ = in_stack_ffffffffffffeb7c;
  auVar2._12_8_ = in_stack_ffffffffffffeb88;
  auVar2._20_8_ = in_stack_ffffffffffffeb90;
  auVar2._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffeba0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_15.field_2 = in_stack_ffffffffffffeba8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_3b8,STR_AMOUNT,(string)(auVar2 << 0x20),SUB81(local_1168,0),description_15,
             inner_15,true);
  __l_06._M_len = 8;
  __l_06._M_array = &local_770;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1258,__l_06,(allocator_type *)&stack0xffffffffffffebb7);
  m_key_name_15._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb7c;
  m_key_name_15._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_15._M_string_length = (size_type)in_RDI;
  m_key_name_15.field_2._M_allocated_capacity = in_stack_ffffffffffffeb88;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffeb90;
  description_16._M_string_length = in_stack_ffffffffffffeba0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb98;
  description_16.field_2 = in_stack_ffffffffffffeba8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar7;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar6;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar8;
  RPCResult::RPCResult(&local_2f0,OBJ,m_key_name_15,description_16,inner_16,SUB81(local_310,0));
  result._4_4_ = in_stack_ffffffffffffeb7c;
  result.m_type = uVar4;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffeb88;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeb90;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffeb98;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeba0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffeba8;
  result._64_8_ = pRVar6;
  result.m_description._M_dataplus._M_p = (pointer)pRVar7;
  result.m_description._M_string_length = (size_type)pRVar8;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffebd0;
  result.m_description.field_2._8_8_ = pRVar9;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar10;
  result.m_cond._M_string_length = (size_type)pRVar11;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffebf0;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffebf8;
  RPCResults::RPCResults(&local_1240,result);
  local_11e8._M_dataplus._M_p = (pointer)&local_11e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11e8,"decodepsbt","");
  local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"\"psbt\"","");
  HelpExampleCli(&local_11c8,&local_11e8,&local_1208);
  paVar1 = &local_11c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c8._M_dataplus._M_p == paVar1) {
    local_1198._8_8_ = local_11c8.field_2._8_8_;
    local_11a8 = &local_1198;
  }
  else {
    local_11a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_11c8._M_dataplus._M_p;
  }
  local_1198._M_allocated_capacity._1_7_ = local_11c8.field_2._M_allocated_capacity._1_7_;
  local_1198._M_local_buf[0] = local_11c8.field_2._M_local_buf[0];
  local_11a0 = local_11c8._M_string_length;
  local_11c8._M_string_length = 0;
  local_11c8.field_2._M_local_buf[0] = '\0';
  pcVar5 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:1065:9)>
           ::_M_manager;
  description_17._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:1065:9)>
       ::_M_invoke;
  description_17._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:1065:9)>
                ::_M_manager;
  description_17.field_2 = in_stack_ffffffffffffeba8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar9;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffebd0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar10;
  examples.m_examples._M_string_length = in_stack_ffffffffffffebf0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar11;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffec00;
  local_11c8._M_dataplus._M_p = (pointer)paVar1;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffeb88)),description_17,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar5 != (code *)0x0) {
    (*pcVar5)(&stack0xffffffffffffeb88,&stack0xffffffffffffeb88,3);
  }
  if (local_11a8 != &local_1198) {
    operator_delete(local_11a8,local_1198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_11c8._M_dataplus._M_p,
                    CONCAT71(local_11c8.field_2._M_allocated_capacity._1_7_,
                             local_11c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
    operator_delete(local_1208._M_dataplus._M_p,local_1208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11e8._M_dataplus._M_p != &local_11e8.field_2) {
    operator_delete(local_11e8._M_dataplus._M_p,local_11e8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1240.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1258);
  lVar3 = 0x440;
  do {
    if ((long *)((long)local_780 + lVar3) != *(long **)((long)local_790 + lVar3)) {
      operator_delete(*(long **)((long)local_790 + lVar3),*(long *)((long)local_780 + lVar3) + 1);
    }
    if ((long *)((long)local_7a0 + lVar3) != *(long **)((long)local_7b0 + lVar3)) {
      operator_delete(*(long **)((long)local_7b0 + lVar3),*(long *)((long)local_7a0 + lVar3) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_838 + lVar3 + 0x68));
    if ((long *)(local_838 + lVar3 + 0x58) != *(long **)(local_838 + lVar3 + 0x48)) {
      operator_delete(*(long **)(local_838 + lVar3 + 0x48),*(long *)(local_838 + lVar3 + 0x58) + 1);
    }
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebb8);
  if (local_1188[0] != local_1178) {
    operator_delete(local_1188[0],local_1178[0] + 1);
  }
  if (local_1168[0] != local_1158) {
    operator_delete(local_1168[0],local_1158[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1108.m_cond._M_dataplus._M_p != &local_1108.m_cond.field_2) {
    operator_delete(local_1108.m_cond._M_dataplus._M_p,
                    local_1108.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1108.m_description._M_dataplus._M_p != &local_1108.m_description.field_2) {
    operator_delete(local_1108.m_description._M_dataplus._M_p,
                    local_1108.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1108.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1108.m_key_name._M_dataplus._M_p != &local_1108.m_key_name.field_2) {
    operator_delete(local_1108.m_key_name._M_dataplus._M_p,
                    local_1108.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebd8);
  if (local_1148[0] != local_1138) {
    operator_delete(local_1148[0],local_1138[0] + 1);
  }
  if (local_1128[0] != local_1118) {
    operator_delete(local_1128[0],local_1118[0] + 1);
  }
  if (local_1080[0] != local_1070) {
    operator_delete(local_1080[0],local_1070[0] + 1);
  }
  if (local_1060[0] != local_1050) {
    operator_delete(local_1060[0],local_1050[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0.m_cond._M_dataplus._M_p != &local_ce0.m_cond.field_2) {
    operator_delete(local_ce0.m_cond._M_dataplus._M_p,
                    local_ce0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0.m_description._M_dataplus._M_p != &local_ce0.m_description.field_2) {
    operator_delete(local_ce0.m_description._M_dataplus._M_p,
                    local_ce0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ce0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0.m_key_name._M_dataplus._M_p != &local_ce0.m_key_name.field_2) {
    operator_delete(local_ce0.m_key_name._M_dataplus._M_p,
                    local_ce0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1368);
  lVar3 = 0x220;
  do {
    if ((long *)(local_f50 + lVar3) != *(long **)((long)local_f60 + lVar3)) {
      operator_delete(*(long **)((long)local_f60 + lVar3),*(long *)(local_f50 + lVar3) + 1);
    }
    if ((long *)((long)local_f70 + lVar3) != *(long **)((long)local_f80 + lVar3)) {
      operator_delete(*(long **)((long)local_f80 + lVar3),*(long *)((long)local_f70 + lVar3) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_fa0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar3));
    if ((long *)((long)local_fb0 + lVar3) != *(long **)((long)local_fc0 + lVar3)) {
      operator_delete(*(long **)((long)local_fc0 + lVar3),*(long *)((long)local_fb0 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec18);
  if (local_1040[0] != local_1030) {
    operator_delete(local_1040[0],local_1030[0] + 1);
  }
  if (local_1020[0] != local_1010) {
    operator_delete(local_1020[0],local_1010[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec38);
  if (local_1000[0] != local_ff0) {
    operator_delete(local_1000[0],local_ff0[0] + 1);
  }
  if (local_fe0[0] != local_fd0) {
    operator_delete(local_fe0[0],local_fd0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec58);
  if (local_fc0[0] != local_fb0) {
    operator_delete(local_fc0[0],local_fb0[0] + 1);
  }
  if (local_fa0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_fa0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_fa0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_fa0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1388);
  if (local_f80[0] != local_f70) {
    operator_delete(local_f80[0],local_f70[0] + 1);
  }
  if (local_f60[0] != (pointer)local_f50) {
    operator_delete(local_f60[0],local_f50._0_8_ + 1);
  }
  if (local_d20[0] != local_d10) {
    operator_delete(local_d20[0],local_d10[0] + 1);
  }
  if (local_d00[0] != local_cf0) {
    operator_delete(local_d00[0],local_cf0[0] + 1);
  }
  if (local_c58[0] != local_c48) {
    operator_delete(local_c58[0],local_c48[0] + 1);
  }
  if (local_c38[0] != local_c28) {
    operator_delete(local_c38[0],local_c28[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1338);
  if (local_c18[0] != local_c08) {
    operator_delete(local_c18[0],local_c08[0] + 1);
  }
  if (local_bf8[0] != local_be8) {
    operator_delete(local_bf8[0],local_be8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940.m_cond._M_dataplus._M_p != &local_940.m_cond.field_2) {
    operator_delete(local_940.m_cond._M_dataplus._M_p,
                    local_940.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940.m_description._M_dataplus._M_p != &local_940.m_description.field_2) {
    operator_delete(local_940.m_description._M_dataplus._M_p,
                    local_940.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_940.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940.m_key_name._M_dataplus._M_p != &local_940.m_key_name.field_2) {
    operator_delete(local_940.m_key_name._M_dataplus._M_p,
                    local_940.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12c0);
  lVar3 = 0x198;
  do {
    if ((long *)(local_b28 + lVar3) != *(long **)((long)local_b38 + lVar3)) {
      operator_delete(*(long **)((long)local_b38 + lVar3),*(long *)(local_b28 + lVar3) + 1);
    }
    if ((long *)((long)local_b48 + lVar3) != *(long **)((long)local_b58 + lVar3)) {
      operator_delete(*(long **)((long)local_b58 + lVar3),*(long *)((long)local_b48 + lVar3) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar3));
    if ((long *)((long)local_b88 + lVar3) != *(long **)((long)local_b98 + lVar3)) {
      operator_delete(*(long **)((long)local_b98 + lVar3),*(long *)((long)local_b88 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1318);
  if (local_bd8[0] != local_bc8) {
    operator_delete(local_bd8[0],local_bc8[0] + 1);
  }
  if (local_bb8[0] != local_ba8) {
    operator_delete(local_bb8[0],local_ba8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12f8);
  if (local_b98[0] != local_b88) {
    operator_delete(local_b98[0],local_b88[0] + 1);
  }
  if (local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_b78.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12d8);
  if (local_b58[0] != local_b48) {
    operator_delete(local_b58[0],local_b48[0] + 1);
  }
  if (local_b38[0] != (pointer)local_b28) {
    operator_delete(local_b38[0],local_b28._0_8_ + 1);
  }
  if (local_980[0] != local_970) {
    operator_delete(local_980[0],local_970[0] + 1);
  }
  if (local_960[0] != local_950) {
    operator_delete(local_960[0],local_950[0] + 1);
  }
  if (local_8b8[0] != local_8a8) {
    operator_delete(local_8b8[0],local_8a8[0] + 1);
  }
  if (local_898[0] != local_888) {
    operator_delete(local_898[0],local_888[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._104_8_ != &local_7c0) {
    operator_delete((void *)local_838._104_8_,local_7c0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_838._72_8_ != local_838 + 0x58) {
    operator_delete((void *)local_838._72_8_,local_838._88_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_838 + 0x28));
  if ((undefined1 *)local_838._8_8_ != local_838 + 0x18) {
    operator_delete((void *)local_838._8_8_,local_838._24_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1288);
  if (local_878[0] != local_868) {
    operator_delete(local_878[0],local_868[0] + 1);
  }
  if (local_858[0] != local_848) {
    operator_delete(local_858[0],local_848[0] + 1);
  }
  if (local_7b0[0] != local_7a0) {
    operator_delete(local_7b0[0],local_7a0[0] + 1);
  }
  if (local_790[0] != local_780) {
    operator_delete(local_790[0],local_780[0] + 1);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan decodepsbt()
{
    return RPCHelpMan{
        "decodepsbt",
        "Return a JSON object representing the serialized, base64-encoded partially signed Bitcoin transaction.",
                {
                    {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "The PSBT base64 string"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::OBJ, "tx", "The decoded network-serialized unsigned transaction.",
                        {
                            {RPCResult::Type::ELISION, "", "The layout is the same as the output of decoderawtransaction."},
                        }},
                        {RPCResult::Type::ARR, "global_xpubs", "",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR, "xpub", "The extended public key this path corresponds to"},
                                {RPCResult::Type::STR_HEX, "master_fingerprint", "The fingerprint of the master key"},
                                {RPCResult::Type::STR, "path", "The path"},
                            }},
                        }},
                        {RPCResult::Type::NUM, "psbt_version", "The PSBT version number. Not to be confused with the unsigned transaction version"},
                        {RPCResult::Type::ARR, "proprietary", "The global proprietary map",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR_HEX, "identifier", "The hex string for the proprietary identifier"},
                                {RPCResult::Type::NUM, "subtype", "The number for the subtype"},
                                {RPCResult::Type::STR_HEX, "key", "The hex for the key"},
                                {RPCResult::Type::STR_HEX, "value", "The hex for the value"},
                            }},
                        }},
                        {RPCResult::Type::OBJ_DYN, "unknown", "The unknown global fields",
                        {
                             {RPCResult::Type::STR_HEX, "key", "(key-value pair) An unknown key-value pair"},
                        }},
                        decodepsbt_inputs,
                        decodepsbt_outputs,
                        {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The transaction fee paid if all UTXOs slots in the PSBT have been filled."},
                    }
                },
                RPCExamples{
                    HelpExampleCli("decodepsbt", "\"psbt\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transactions
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    UniValue result(UniValue::VOBJ);

    // Add the decoded tx
    UniValue tx_univ(UniValue::VOBJ);
    TxToUniv(CTransaction(*psbtx.tx), /*block_hash=*/uint256(), /*entry=*/tx_univ, /*include_hex=*/false);
    result.pushKV("tx", std::move(tx_univ));

    // Add the global xpubs
    UniValue global_xpubs(UniValue::VARR);
    for (std::pair<KeyOriginInfo, std::set<CExtPubKey>> xpub_pair : psbtx.m_xpubs) {
        for (auto& xpub : xpub_pair.second) {
            std::vector<unsigned char> ser_xpub;
            ser_xpub.assign(BIP32_EXTKEY_WITH_VERSION_SIZE, 0);
            xpub.EncodeWithVersion(ser_xpub.data());

            UniValue keypath(UniValue::VOBJ);
            keypath.pushKV("xpub", EncodeBase58Check(ser_xpub));
            keypath.pushKV("master_fingerprint", HexStr(Span<unsigned char>(xpub_pair.first.fingerprint, xpub_pair.first.fingerprint + 4)));
            keypath.pushKV("path", WriteHDKeypath(xpub_pair.first.path));
            global_xpubs.push_back(std::move(keypath));
        }
    }
    result.pushKV("global_xpubs", std::move(global_xpubs));

    // PSBT version
    result.pushKV("psbt_version", static_cast<uint64_t>(psbtx.GetVersion()));

    // Proprietary
    UniValue proprietary(UniValue::VARR);
    for (const auto& entry : psbtx.m_proprietary) {
        UniValue this_prop(UniValue::VOBJ);
        this_prop.pushKV("identifier", HexStr(entry.identifier));
        this_prop.pushKV("subtype", entry.subtype);
        this_prop.pushKV("key", HexStr(entry.key));
        this_prop.pushKV("value", HexStr(entry.value));
        proprietary.push_back(std::move(this_prop));
    }
    result.pushKV("proprietary", std::move(proprietary));

    // Unknown data
    UniValue unknowns(UniValue::VOBJ);
    for (auto entry : psbtx.unknown) {
        unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
    }
    result.pushKV("unknown", std::move(unknowns));

    // inputs
    CAmount total_in = 0;
    bool have_all_utxos = true;
    UniValue inputs(UniValue::VARR);
    for (unsigned int i = 0; i < psbtx.inputs.size(); ++i) {
        const PSBTInput& input = psbtx.inputs[i];
        UniValue in(UniValue::VOBJ);
        // UTXOs
        bool have_a_utxo = false;
        CTxOut txout;
        if (!input.witness_utxo.IsNull()) {
            txout = input.witness_utxo;

            UniValue o(UniValue::VOBJ);
            ScriptToUniv(txout.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);

            UniValue out(UniValue::VOBJ);
            out.pushKV("amount", ValueFromAmount(txout.nValue));
            out.pushKV("scriptPubKey", std::move(o));

            in.pushKV("witness_utxo", std::move(out));

            have_a_utxo = true;
        }
        if (input.non_witness_utxo) {
            txout = input.non_witness_utxo->vout[psbtx.tx->vin[i].prevout.n];

            UniValue non_wit(UniValue::VOBJ);
            TxToUniv(*input.non_witness_utxo, /*block_hash=*/uint256(), /*entry=*/non_wit, /*include_hex=*/false);
            in.pushKV("non_witness_utxo", std::move(non_wit));

            have_a_utxo = true;
        }
        if (have_a_utxo) {
            if (MoneyRange(txout.nValue) && MoneyRange(total_in + txout.nValue)) {
                total_in += txout.nValue;
            } else {
                // Hack to just not show fee later
                have_all_utxos = false;
            }
        } else {
            have_all_utxos = false;
        }

        // Partial sigs
        if (!input.partial_sigs.empty()) {
            UniValue partial_sigs(UniValue::VOBJ);
            for (const auto& sig : input.partial_sigs) {
                partial_sigs.pushKV(HexStr(sig.second.first), HexStr(sig.second.second));
            }
            in.pushKV("partial_signatures", std::move(partial_sigs));
        }

        // Sighash
        if (input.sighash_type != std::nullopt) {
            in.pushKV("sighash", SighashToStr((unsigned char)*input.sighash_type));
        }

        // Redeem script and witness script
        if (!input.redeem_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(input.redeem_script, /*out=*/r);
            in.pushKV("redeem_script", std::move(r));
        }
        if (!input.witness_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(input.witness_script, /*out=*/r);
            in.pushKV("witness_script", std::move(r));
        }

        // keypaths
        if (!input.hd_keypaths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (auto entry : input.hd_keypaths) {
                UniValue keypath(UniValue::VOBJ);
                keypath.pushKV("pubkey", HexStr(entry.first));

                keypath.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(entry.second.fingerprint)));
                keypath.pushKV("path", WriteHDKeypath(entry.second.path));
                keypaths.push_back(std::move(keypath));
            }
            in.pushKV("bip32_derivs", std::move(keypaths));
        }

        // Final scriptSig and scriptwitness
        if (!input.final_script_sig.empty()) {
            UniValue scriptsig(UniValue::VOBJ);
            scriptsig.pushKV("asm", ScriptToAsmStr(input.final_script_sig, true));
            scriptsig.pushKV("hex", HexStr(input.final_script_sig));
            in.pushKV("final_scriptSig", std::move(scriptsig));
        }
        if (!input.final_script_witness.IsNull()) {
            UniValue txinwitness(UniValue::VARR);
            for (const auto& item : input.final_script_witness.stack) {
                txinwitness.push_back(HexStr(item));
            }
            in.pushKV("final_scriptwitness", std::move(txinwitness));
        }

        // Ripemd160 hash preimages
        if (!input.ripemd160_preimages.empty()) {
            UniValue ripemd160_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.ripemd160_preimages) {
                ripemd160_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("ripemd160_preimages", std::move(ripemd160_preimages));
        }

        // Sha256 hash preimages
        if (!input.sha256_preimages.empty()) {
            UniValue sha256_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.sha256_preimages) {
                sha256_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("sha256_preimages", std::move(sha256_preimages));
        }

        // Hash160 hash preimages
        if (!input.hash160_preimages.empty()) {
            UniValue hash160_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.hash160_preimages) {
                hash160_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("hash160_preimages", std::move(hash160_preimages));
        }

        // Hash256 hash preimages
        if (!input.hash256_preimages.empty()) {
            UniValue hash256_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.hash256_preimages) {
                hash256_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("hash256_preimages", std::move(hash256_preimages));
        }

        // Taproot key path signature
        if (!input.m_tap_key_sig.empty()) {
            in.pushKV("taproot_key_path_sig", HexStr(input.m_tap_key_sig));
        }

        // Taproot script path signatures
        if (!input.m_tap_script_sigs.empty()) {
            UniValue script_sigs(UniValue::VARR);
            for (const auto& [pubkey_leaf, sig] : input.m_tap_script_sigs) {
                const auto& [xonly, leaf_hash] = pubkey_leaf;
                UniValue sigobj(UniValue::VOBJ);
                sigobj.pushKV("pubkey", HexStr(xonly));
                sigobj.pushKV("leaf_hash", HexStr(leaf_hash));
                sigobj.pushKV("sig", HexStr(sig));
                script_sigs.push_back(std::move(sigobj));
            }
            in.pushKV("taproot_script_path_sigs", std::move(script_sigs));
        }

        // Taproot leaf scripts
        if (!input.m_tap_scripts.empty()) {
            UniValue tap_scripts(UniValue::VARR);
            for (const auto& [leaf, control_blocks] : input.m_tap_scripts) {
                const auto& [script, leaf_ver] = leaf;
                UniValue script_info(UniValue::VOBJ);
                script_info.pushKV("script", HexStr(script));
                script_info.pushKV("leaf_ver", leaf_ver);
                UniValue control_blocks_univ(UniValue::VARR);
                for (const auto& control_block : control_blocks) {
                    control_blocks_univ.push_back(HexStr(control_block));
                }
                script_info.pushKV("control_blocks", std::move(control_blocks_univ));
                tap_scripts.push_back(std::move(script_info));
            }
            in.pushKV("taproot_scripts", std::move(tap_scripts));
        }

        // Taproot bip32 keypaths
        if (!input.m_tap_bip32_paths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (const auto& [xonly, leaf_origin] : input.m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                UniValue path_obj(UniValue::VOBJ);
                path_obj.pushKV("pubkey", HexStr(xonly));
                path_obj.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(origin.fingerprint)));
                path_obj.pushKV("path", WriteHDKeypath(origin.path));
                UniValue leaf_hashes_arr(UniValue::VARR);
                for (const auto& leaf_hash : leaf_hashes) {
                    leaf_hashes_arr.push_back(HexStr(leaf_hash));
                }
                path_obj.pushKV("leaf_hashes", std::move(leaf_hashes_arr));
                keypaths.push_back(std::move(path_obj));
            }
            in.pushKV("taproot_bip32_derivs", std::move(keypaths));
        }

        // Taproot internal key
        if (!input.m_tap_internal_key.IsNull()) {
            in.pushKV("taproot_internal_key", HexStr(input.m_tap_internal_key));
        }

        // Write taproot merkle root
        if (!input.m_tap_merkle_root.IsNull()) {
            in.pushKV("taproot_merkle_root", HexStr(input.m_tap_merkle_root));
        }

        // Proprietary
        if (!input.m_proprietary.empty()) {
            UniValue proprietary(UniValue::VARR);
            for (const auto& entry : input.m_proprietary) {
                UniValue this_prop(UniValue::VOBJ);
                this_prop.pushKV("identifier", HexStr(entry.identifier));
                this_prop.pushKV("subtype", entry.subtype);
                this_prop.pushKV("key", HexStr(entry.key));
                this_prop.pushKV("value", HexStr(entry.value));
                proprietary.push_back(std::move(this_prop));
            }
            in.pushKV("proprietary", std::move(proprietary));
        }

        // Unknown data
        if (input.unknown.size() > 0) {
            UniValue unknowns(UniValue::VOBJ);
            for (auto entry : input.unknown) {
                unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
            }
            in.pushKV("unknown", std::move(unknowns));
        }

        inputs.push_back(std::move(in));
    }
    result.pushKV("inputs", std::move(inputs));

    // outputs
    CAmount output_value = 0;
    UniValue outputs(UniValue::VARR);
    for (unsigned int i = 0; i < psbtx.outputs.size(); ++i) {
        const PSBTOutput& output = psbtx.outputs[i];
        UniValue out(UniValue::VOBJ);
        // Redeem script and witness script
        if (!output.redeem_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(output.redeem_script, /*out=*/r);
            out.pushKV("redeem_script", std::move(r));
        }
        if (!output.witness_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(output.witness_script, /*out=*/r);
            out.pushKV("witness_script", std::move(r));
        }

        // keypaths
        if (!output.hd_keypaths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (auto entry : output.hd_keypaths) {
                UniValue keypath(UniValue::VOBJ);
                keypath.pushKV("pubkey", HexStr(entry.first));
                keypath.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(entry.second.fingerprint)));
                keypath.pushKV("path", WriteHDKeypath(entry.second.path));
                keypaths.push_back(std::move(keypath));
            }
            out.pushKV("bip32_derivs", std::move(keypaths));
        }

        // Taproot internal key
        if (!output.m_tap_internal_key.IsNull()) {
            out.pushKV("taproot_internal_key", HexStr(output.m_tap_internal_key));
        }

        // Taproot tree
        if (!output.m_tap_tree.empty()) {
            UniValue tree(UniValue::VARR);
            for (const auto& [depth, leaf_ver, script] : output.m_tap_tree) {
                UniValue elem(UniValue::VOBJ);
                elem.pushKV("depth", (int)depth);
                elem.pushKV("leaf_ver", (int)leaf_ver);
                elem.pushKV("script", HexStr(script));
                tree.push_back(std::move(elem));
            }
            out.pushKV("taproot_tree", std::move(tree));
        }

        // Taproot bip32 keypaths
        if (!output.m_tap_bip32_paths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (const auto& [xonly, leaf_origin] : output.m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                UniValue path_obj(UniValue::VOBJ);
                path_obj.pushKV("pubkey", HexStr(xonly));
                path_obj.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(origin.fingerprint)));
                path_obj.pushKV("path", WriteHDKeypath(origin.path));
                UniValue leaf_hashes_arr(UniValue::VARR);
                for (const auto& leaf_hash : leaf_hashes) {
                    leaf_hashes_arr.push_back(HexStr(leaf_hash));
                }
                path_obj.pushKV("leaf_hashes", std::move(leaf_hashes_arr));
                keypaths.push_back(std::move(path_obj));
            }
            out.pushKV("taproot_bip32_derivs", std::move(keypaths));
        }

        // Proprietary
        if (!output.m_proprietary.empty()) {
            UniValue proprietary(UniValue::VARR);
            for (const auto& entry : output.m_proprietary) {
                UniValue this_prop(UniValue::VOBJ);
                this_prop.pushKV("identifier", HexStr(entry.identifier));
                this_prop.pushKV("subtype", entry.subtype);
                this_prop.pushKV("key", HexStr(entry.key));
                this_prop.pushKV("value", HexStr(entry.value));
                proprietary.push_back(std::move(this_prop));
            }
            out.pushKV("proprietary", std::move(proprietary));
        }

        // Unknown data
        if (output.unknown.size() > 0) {
            UniValue unknowns(UniValue::VOBJ);
            for (auto entry : output.unknown) {
                unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
            }
            out.pushKV("unknown", std::move(unknowns));
        }

        outputs.push_back(std::move(out));

        // Fee calculation
        if (MoneyRange(psbtx.tx->vout[i].nValue) && MoneyRange(output_value + psbtx.tx->vout[i].nValue)) {
            output_value += psbtx.tx->vout[i].nValue;
        } else {
            // Hack to just not show fee later
            have_all_utxos = false;
        }
    }
    result.pushKV("outputs", std::move(outputs));
    if (have_all_utxos) {
        result.pushKV("fee", ValueFromAmount(total_in - output_value));
    }

    return result;
},
    };
}